

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O0

bool __thiscall Pathie::entry_iterator::operator==(entry_iterator *this,entry_iterator *other)

{
  bool local_29;
  entry_iterator *other_local;
  entry_iterator *this_local;
  
  if (other->mp_directory == (Path *)0x0) {
    this_local._7_1_ = this->mp_cur == (void *)0x0;
  }
  else {
    local_29 = false;
    if (this->mp_directory == other->mp_directory) {
      local_29 = this->mp_cur == other->mp_cur;
    }
    this_local._7_1_ = local_29;
  }
  return this_local._7_1_;
}

Assistant:

bool entry_iterator::operator==(const entry_iterator& other) const
{
  if (other.mp_directory == NULL) {
    /* `mp_directory' is only null for the terminal iterator, that is,
     * a test for the terminal iterator was requested. An entry_iterator
     * is terminated when `mp_cur' is null, so that's what is returned
     * in reality when a test with the terminal iterator is
     * requested. */
    return !mp_cur;
  }
  else {
    return mp_directory == other.mp_directory && mp_cur == other.mp_cur;
  }
}